

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O3

int zhash_get_volatile(zhash_t *zh,void *key,void *out_value)

{
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (*zh->hash)(key);
  uVar5 = zh->nentries - 1U & uVar1;
  pcVar3 = zh->entries;
  uVar4 = zh->entrysz * uVar5;
  while( true ) {
    if (pcVar3[uVar4] == '\0') {
      return 0;
    }
    iVar2 = (*zh->equals)(key,pcVar3 + (uVar4 + 1));
    if (iVar2 != 0) break;
    uVar5 = uVar5 + 1 & zh->nentries - 1U;
    pcVar3 = zh->entries;
    uVar4 = zh->entrysz * uVar5;
  }
  *(char **)out_value = zh->entries + (ulong)(uVar5 * zh->entrysz + 1) + zh->keysz;
  return 1;
}

Assistant:

int zhash_get_volatile(const zhash_t *zh, const void *key, void *out_value)
{
    uint32_t code = zh->hash(key);
    uint32_t entry_idx = code & (zh->nentries - 1);

    while (zh->entries[entry_idx * zh->entrysz]) {
        void *this_key = &zh->entries[entry_idx * zh->entrysz + 1];
        if (zh->equals(key, this_key)) {
            *((void**) out_value) = &zh->entries[entry_idx * zh->entrysz + 1 + zh->keysz];
            return 1;
        }

        entry_idx = (entry_idx + 1) & (zh->nentries - 1);
    }

    return 0;
}